

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall
JsonString_Unterminated_Test::~JsonString_Unterminated_Test(JsonString_Unterminated_Test *this)

{
  JsonString_Unterminated_Test *this_local;
  
  anon_unknown.dwarf_1403f7::JsonString::~JsonString(&this->super_JsonString);
  return;
}

Assistant:

TEST_F (JsonString, Unterminated) {
    auto p = json::make_parser (proxy_);
    p.input (R"("hello)"s).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::expected_close_quote));
    EXPECT_EQ (p.coordinate (), (json::coord{7U, 1U}));
}